

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_error_mgr *pjVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  uint local_54;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar8 = *(int *)((long)&pjVar2[4].start_pass + 4);
    if (iVar8 == 0) {
      process_restart(cinfo);
      iVar8 = *(int *)((long)&pjVar2[4].start_pass + 4);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = iVar8 + -1;
  }
  if (*(int *)&pjVar2[2].start_pass != -1) {
    piVar3 = cinfo->natural_order;
    paJVar4 = *MCU_data;
    bVar1 = (byte)cinfo->Al;
    iVar8 = cinfo->cur_comp_info[0]->ac_tbl_no;
    uVar9 = cinfo->Se;
    uVar12 = uVar9;
    while ((local_54 = (int)uVar9 >> 0x1f & uVar9, 0 < (int)uVar12 &&
           (local_54 = uVar12, (*paJVar4)[piVar3[uVar12]] == 0))) {
      uVar12 = uVar12 - 1;
    }
    iVar13 = cinfo->Ss;
    while (iVar13 <= (int)uVar9) {
      p_Var16 = (&pjVar2[0xc].decode_mcu)[iVar8];
      lVar15 = (long)(iVar13 * 3 + -3);
      if (((int)local_54 < iVar13) &&
         (iVar10 = arith_decode(cinfo,(uchar *)(p_Var16 + lVar15)), iVar10 != 0)) {
        return 1;
      }
      lVar14 = (long)iVar13 + -1;
      p_Var16 = p_Var16 + lVar15 + 2;
      while( true ) {
        iVar13 = iVar13 + 1;
        iVar10 = piVar3[lVar14 + 1];
        sVar7 = (short)(1 << (bVar1 & 0x1f));
        sVar6 = (short)(-1 << (bVar1 & 0x1f));
        if ((*paJVar4)[iVar10] != 0) break;
        iVar11 = arith_decode(cinfo,(uchar *)(p_Var16 + -1));
        if (iVar11 != 0) {
          iVar11 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
          if (iVar11 != 0) {
            sVar7 = sVar6;
          }
          (*paJVar4)[iVar10] = sVar7;
          goto LAB_0011312f;
        }
        lVar14 = lVar14 + 1;
        p_Var16 = p_Var16 + 3;
        if (cinfo->Se <= lVar14) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x75;
          (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
          *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
          return 1;
        }
      }
      iVar11 = arith_decode(cinfo,(uchar *)p_Var16);
      if (iVar11 != 0) {
        if (-1 < (*paJVar4)[iVar10]) {
          sVar6 = sVar7;
        }
        (*paJVar4)[iVar10] = (*paJVar4)[iVar10] + sVar6;
      }
LAB_0011312f:
      uVar9 = cinfo->Se;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */
  m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
    for (;;) {
      thiscoef = *block + natural_order[k];
      if (*thiscoef) {				/* previously nonzero coef */
	if (arith_decode(cinfo, st + 2)) {
	  if (*thiscoef < 0)
	    *thiscoef += m1;
	  else
	    *thiscoef += p1;
	}
	break;
      }
      if (arith_decode(cinfo, st + 1)) {	/* newly nonzero coef */
	if (arith_decode(cinfo, entropy->fixed_bin))
	  *thiscoef = m1;
	else
	  *thiscoef = p1;
	break;
      }
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
  }

  return TRUE;
}